

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_cell_tuv(REF_GEOM ref_geom,REF_INT node,REF_INT *nodes,REF_INT type,REF_DBL *param,
                 REF_INT *sens)

{
  int iVar1;
  REF_INT RVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  long lVar5;
  uint uVar6;
  REF_INT RVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  REF_INT from_geom;
  undefined8 local_c8;
  REF_INT *local_c0;
  REF_INT *local_b8;
  double local_b0;
  double trange [2];
  REF_INT geom;
  double local_88;
  double dStack_80;
  double uv [2];
  double uvtmax [2];
  double uv1 [2];
  
  if (type - 1U < 2) {
    local_b0 = (double)(ulong)(uint)type;
    uVar8 = nodes[(long)local_b0 + 1];
    uVar14 = 0xffffffffffffffff;
    for (uVar9 = 0; iVar13 = (int)uVar14, type + 1 != uVar9; uVar9 = uVar9 + 1) {
      if (nodes[uVar9] == node) {
        if (iVar13 != -1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x302,"ref_geom_cell_tuv","node found twice in nodes",0xffffffffffffffff,
                 (long)iVar13);
          return 1;
        }
        uVar14 = uVar9 & 0xffffffff;
      }
    }
    if (iVar13 != -1) {
      local_c0 = sens;
      uVar6 = ref_geom_find(ref_geom,node,type,uVar8,&geom);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x30b,"ref_geom_cell_tuv",(ulong)uVar6,"not found");
        printf(" %d type %d id\n",(ulong)(uint)type,(ulong)uVar8);
        ref_geom_tattle(ref_geom,node);
        return uVar6;
      }
      pRVar3 = ref_geom->descr;
      lVar11 = (long)geom;
      iVar1 = pRVar3[lVar11 * 6 + 3];
      if ((iVar1 == 0) && (pRVar3[lVar11 * 6 + 4] == 0)) {
        pRVar4 = ref_geom->param;
        *param = pRVar4[lVar11 * 2];
        if (1 < type) {
          param[1] = pRVar4[(int)(geom * 2 | 1)];
        }
        *local_c0 = 0;
        return 0;
      }
      if (type == 1) {
        uVar6 = ref_egads_edge_trange(ref_geom,uVar8,trange);
        if (uVar6 == 0) {
          uVar6 = ref_geom_tuv(ref_geom,nodes[1 - iVar13],1,uVar8,uv);
          if (uVar6 == 0) {
            if ((0.0 <= uv[0] - trange[0]) && (0.0 <= trange[1] - uv[0])) {
              if (uv[0] - trange[0] < trange[1] - uv[0]) {
                *local_c0 = 1;
                *param = trange[0];
                return 0;
              }
              *local_c0 = -1;
              *param = trange[1];
              return 0;
            }
            printf(" from t = %e %e %e, dist = %e %e\n");
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   799,"ref_geom_cell_tuv","from node not in trange");
            return 1;
          }
          pcVar12 = "from tuv";
          uVar10 = 0x319;
        }
        else {
          pcVar12 = "trange";
          uVar10 = 0x317;
        }
      }
      else if (pRVar3[lVar11 * 6 + 4] == 0) {
        local_88 = (double)(uVar14 & 0xffffffff);
        local_c8._4_4_ = (undefined4)((ulong)(lVar11 * 6) >> 0x20);
        local_c8 = CONCAT44(local_c8._4_4_,0xffffffff);
        local_b8 = pRVar3;
        for (dVar15 = 0.0; (ulong)dVar15 <= (ulong)local_b0; dVar15 = (double)((long)dVar15 + 1)) {
          RVar2 = nodes[(long)dVar15];
          uVar6 = ref_geom_find(ref_geom,RVar2,type,uVar8,&from_geom);
          if (uVar6 != 0) {
            pcVar12 = "not found";
            uVar10 = 0x32e;
            goto LAB_00147b92;
          }
          if ((local_88 != dVar15) && (local_b8[(long)from_geom * 6 + 3] == 0)) {
            RVar7 = (REF_INT)local_c8;
            if (local_b8[(long)from_geom * 6 + 4] == 0) {
              RVar7 = RVar2;
            }
            local_c8 = CONCAT44(local_c8._4_4_,RVar7);
          }
        }
        if ((REF_INT)local_c8 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x33a,"ref_geom_cell_tuv","can\'t find from tuv in tri cell");
          ref_geom_tattle(ref_geom,*nodes);
          ref_geom_tattle(ref_geom,nodes[1]);
          ref_geom_tattle(ref_geom,nodes[2]);
          printf("faceid %d node %d node_index %d\n",(ulong)uVar8,(ulong)(uint)node,
                 uVar14 & 0xffffffff);
          return 1;
        }
        uVar6 = ref_geom_tuv(ref_geom,(REF_INT)local_c8,2,uVar8,uv);
        if (uVar6 == 0) {
          uVar6 = ref_geom_tuv(ref_geom,node,1,iVar1,uvtmax);
          if (uVar6 == 0) {
            local_b0 = uvtmax[0];
            uVar6 = ref_egads_edge_face_uv(ref_geom,iVar1,uVar8,1,uvtmax[0],trange);
            if (uVar6 == 0) {
              uVar6 = ref_egads_edge_face_uv(ref_geom,iVar1,uVar8,-1,local_b0,uv1);
              if (uVar6 == 0) {
                dVar15 = (trange[0] - uv[0]) * (trange[0] - uv[0]);
                dVar18 = (uv1[0] - uv[0]) * (uv1[0] - uv[0]);
                auVar16._8_8_ = dVar18;
                auVar16._0_8_ = dVar15;
                auVar17._8_8_ = (uv1[1] - uv[1]) * (uv1[1] - uv[1]) + dVar18;
                auVar17._0_8_ = (trange[1] - uv[1]) * (trange[1] - uv[1]) + dVar15;
                auVar17 = sqrtpd(auVar16,auVar17);
                if (auVar17._0_8_ < auVar17._8_8_) {
                  *local_c0 = 1;
                  *param = trange[0];
                  param[1] = trange[1];
                  return 0;
                }
                *local_c0 = -1;
                *param = uv1[0];
                param[1] = uv1[1];
                return 0;
              }
              pcVar12 = "uv -1";
              uVar10 = 0x33f;
            }
            else {
              pcVar12 = "uv 1";
              uVar10 = 0x33e;
            }
          }
          else {
            pcVar12 = "edge t0";
            uVar10 = 0x33d;
          }
        }
        else {
          pcVar12 = "from uv";
          uVar10 = 0x33c;
        }
      }
      else {
        local_88 = 0.0;
        dStack_80 = 0.0;
        local_b8 = (REF_INT *)((ulong)local_b8 & 0xffffffff00000000);
        local_c8 = lVar11 * 6;
        for (dVar15 = 0.0; pRVar3 = local_c0, lVar5 = local_c8, (ulong)dVar15 <= (ulong)local_b0;
            dVar15 = (double)((long)dVar15 + 1)) {
          RVar2 = nodes[(long)dVar15];
          uVar6 = ref_geom_find(ref_geom,RVar2,type,uVar8,&from_geom);
          if (uVar6 != 0) {
            pcVar12 = "not found";
            uVar10 = 0x351;
            goto LAB_00147b92;
          }
          if ((ref_geom->descr[(long)from_geom * 6 + 3] == 0) &&
             (ref_geom->descr[(long)from_geom * 6 + 4] == 0)) {
            uVar6 = ref_geom_tuv(ref_geom,RVar2,2,uVar8,uv);
            if (uVar6 != 0) {
              pcVar12 = "from uv";
              uVar10 = 0x355;
              goto LAB_00147b92;
            }
            local_88 = local_88 + uv[0];
            dStack_80 = dStack_80 + uv[1];
            local_b8 = (REF_INT *)CONCAT44(local_b8._4_4_,(int)local_b8 + 1);
          }
        }
        iVar13 = (int)local_b8;
        if ((int)local_b8 < 1) {
          pcVar12 = "no seed uv found for DEGEN";
          uVar10 = 0x35b;
          goto LAB_0014781c;
        }
        *local_c0 = 0;
        iVar1 = ref_geom->descr[local_c8 + 4];
        RVar2 = -iVar1;
        if (0 < iVar1) {
          RVar2 = iVar1;
        }
        uVar6 = ref_egads_edge_trange(ref_geom,RVar2,trange);
        if (uVar6 == 0) {
          uVar8 = (uint)lVar5 | 1;
          uVar6 = ref_egads_edge_face_uv
                            (ref_geom,RVar2,ref_geom->descr[(int)uVar8],*pRVar3,trange[0],uv1);
          if (uVar6 == 0) {
            uVar6 = ref_egads_edge_face_uv
                              (ref_geom,RVar2,ref_geom->descr[(int)uVar8],*pRVar3,trange[1],uvtmax);
            if (uVar6 == 0) {
              if (0 < ref_geom->descr[local_c8 + 4]) {
                dStack_80 = dStack_80 / (double)iVar13;
                *param = ref_geom->param[lVar11 * 2];
                dVar15 = uv1[1];
                if (uvtmax[1] <= uv1[1]) {
                  dVar15 = uvtmax[1];
                }
                if (dStack_80 <= dVar15) {
                  dStack_80 = dVar15;
                }
                if (uv1[1] <= uvtmax[1]) {
                  uv1[1] = uvtmax[1];
                }
                if (uv1[1] <= dStack_80) {
                  dStack_80 = uv1[1];
                }
                param[1] = dStack_80;
                return 0;
              }
              local_88 = local_88 / (double)iVar13;
              dVar15 = uv1[0];
              if (uvtmax[0] <= uv1[0]) {
                dVar15 = uvtmax[0];
              }
              if (local_88 <= dVar15) {
                local_88 = dVar15;
              }
              if (uv1[0] <= uvtmax[0]) {
                uv1[0] = uvtmax[0];
              }
              if (uv1[0] <= local_88) {
                local_88 = uv1[0];
              }
              *param = local_88;
              param[1] = ref_geom->param[geom * 2 + 1];
              return 0;
            }
            pcVar12 = "uv t max";
            uVar10 = 0x369;
          }
          else {
            pcVar12 = "uv t min";
            uVar10 = 0x365;
          }
        }
        else {
          pcVar12 = "trange";
          uVar10 = 0x361;
        }
      }
LAB_00147b92:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10
             ,"ref_geom_cell_tuv",(ulong)uVar6,pcVar12);
      return uVar6;
    }
    pcVar12 = "node not found in nodes";
    uVar10 = 0x306;
  }
  else {
    pcVar12 = "type not allowed";
    uVar10 = 0x2fc;
  }
LAB_0014781c:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10,
         "ref_geom_cell_tuv",pcVar12);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_cell_tuv(REF_GEOM ref_geom, REF_INT node,
                                     REF_INT *nodes, REF_INT type,
                                     REF_DBL *param, REF_INT *sens) {
  REF_INT node_per;
  REF_INT id, edgeid, geom, from, from_geom;
  REF_INT node_index, cell_node;
  double trange[2], uv[2], uv0[2], uv1[2], uvtmin[2], uvtmax[2];
  REF_DBL from_param[2], t;
  REF_DBL dist0, dist1;
  REF_INT hits;

  RAS(1 <= type && type <= 2, "type not allowed");
  node_per = type + 1;
  id = nodes[node_per];
  node_index = REF_EMPTY;
  for (cell_node = 0; cell_node < node_per; cell_node++) {
    if (node == nodes[cell_node]) {
      REIS(REF_EMPTY, node_index, "node found twice in nodes");
      node_index = cell_node;
    }
  }
  RAS(REF_EMPTY != node_index, "node not found in nodes");

  RSB(ref_geom_find(ref_geom, node, type, id, &geom), "not found", {
    printf(" %d type %d id\n", type, id);
    ref_geom_tattle(ref_geom, node);
  });

  if (0 == ref_geom_jump(ref_geom, geom) &&
      0 == ref_geom_degen(ref_geom, geom)) {
    if (type > 0) param[0] = ref_geom_param(ref_geom, 0, geom);
    if (type > 1) param[1] = ref_geom_param(ref_geom, 1, geom);
    *sens = 0;
    return REF_SUCCESS;
  }

  switch (type) {
    case REF_GEOM_EDGE:
      RSS(ref_egads_edge_trange(ref_geom, id, trange), "trange");
      from = nodes[1 - node_index];
      RSS(ref_geom_tuv(ref_geom, from, type, id, from_param), "from tuv");
      dist0 = from_param[0] - trange[0];
      dist1 = trange[1] - from_param[0];
      if (dist0 < 0.0 || dist1 < 0.0) {
        printf(" from t = %e %e %e, dist = %e %e\n", trange[0], from_param[0],
               trange[1], dist0, dist1);
        THROW("from node not in trange");
      }
      if (dist0 < dist1) {
        *sens = 1;
        param[0] = trange[0];
      } else {
        *sens = -1;
        param[0] = trange[1];
      }
      break;
    case REF_GEOM_FACE:
      if (0 == ref_geom_degen(ref_geom, geom)) {
        from = REF_EMPTY;
        for (cell_node = 0; cell_node < node_per; cell_node++) {
          RSS(ref_geom_find(ref_geom, nodes[cell_node], type, id, &from_geom),
              "not found");
          if (node_index != cell_node &&
              0 == ref_geom_jump(ref_geom, from_geom) &&
              0 == ref_geom_degen(ref_geom, from_geom)) {
            from = nodes[cell_node];
          }
        }
        RAB(REF_EMPTY != from, "can't find from tuv in tri cell", {
          ref_geom_tattle(ref_geom, nodes[0]);
          ref_geom_tattle(ref_geom, nodes[1]);
          ref_geom_tattle(ref_geom, nodes[2]);
          printf("faceid %d node %d node_index %d\n", id, node, node_index);
        });
        edgeid = ref_geom_jump(ref_geom, geom);
        RSS(ref_geom_tuv(ref_geom, from, REF_GEOM_FACE, id, uv), "from uv");
        RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_EDGE, edgeid, &t), "edge t0");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid, id, 1, t, uv0), "uv 1");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid, id, -1, t, uv1), "uv -1");
        dist0 = sqrt(pow(uv0[0] - uv[0], 2) + pow(uv0[1] - uv[1], 2));
        dist1 = sqrt(pow(uv1[0] - uv[0], 2) + pow(uv1[1] - uv[1], 2));
        if (dist0 < dist1) {
          *sens = 1;
          param[0] = uv0[0];
          param[1] = uv0[1];
        } else {
          *sens = -1;
          param[0] = uv1[0];
          param[1] = uv1[1];
        }
      } else {
        uv0[0] = 0.0;
        uv0[1] = 0.0;
        hits = 0;
        for (cell_node = 0; cell_node < node_per; cell_node++) {
          RSS(ref_geom_find(ref_geom, nodes[cell_node], type, id, &from_geom),
              "not found");
          if (0 == ref_geom_jump(ref_geom, from_geom) &&
              0 == ref_geom_degen(ref_geom, from_geom)) {
            RSS(ref_geom_tuv(ref_geom, nodes[cell_node], REF_GEOM_FACE, id, uv),
                "from uv");
            uv0[0] += uv[0];
            uv0[1] += uv[1];
            hits++;
          }
        }
        RAS(0 < hits, "no seed uv found for DEGEN");
        uv0[0] /= (REF_DBL)hits;
        uv0[1] /= (REF_DBL)hits;

        *sens = 0;
        edgeid = ABS(ref_geom_degen(ref_geom, geom));
        RSS(ref_egads_edge_trange(ref_geom, edgeid, trange), "trange");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid,
                                   ref_geom_id(ref_geom, geom), *sens,
                                   trange[0], uvtmin),
            "uv t min");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid,
                                   ref_geom_id(ref_geom, geom), *sens,
                                   trange[1], uvtmax),
            "uv t max");
        /* edgeid sign convention defined in ref_geom_mark_jump_degen */
        if (0 < ref_geom_degen(ref_geom, geom)) {
          param[0] = ref_geom_param(ref_geom, 0, geom);
          param[1] = uv0[1];
          param[1] = MAX(param[1], MIN(uvtmin[1], uvtmax[1]));
          param[1] = MIN(param[1], MAX(uvtmin[1], uvtmax[1]));
        } else {
          param[0] = uv0[0];
          param[0] = MAX(param[0], MIN(uvtmin[0], uvtmax[0]));
          param[0] = MIN(param[0], MAX(uvtmin[0], uvtmax[0]));
          param[1] = ref_geom_param(ref_geom, 1, geom);
        }
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "can't to geom type yet");
  }

  return REF_SUCCESS;
}